

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_fast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *plVar1;
  long *plVar2;
  undefined8 *puVar3;
  BYTE *iEnd;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  ZSTD_matchState_t *pZVar7;
  BYTE *mEnd;
  BYTE *pBVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  long *plVar11;
  undefined8 uVar12;
  char cVar13;
  char cVar14;
  U32 UVar15;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  byte bVar19;
  uint uVar20;
  long *plVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  U32 UVar27;
  long *plVar28;
  long lVar29;
  seqDef *psVar30;
  int iVar31;
  BYTE *iStart;
  uint uVar32;
  BYTE *litEnd;
  BYTE *pBVar34;
  int *piVar35;
  U32 UVar36;
  long lVar37;
  U32 local_f4;
  U32 dictIndexDelta;
  U32 prefixStartIndex;
  BYTE *base;
  BYTE *litLimit_w_2;
  BYTE *prefixStart;
  BYTE *litLimit_w;
  U32 dictStartIndex;
  ulong uVar33;
  
  uVar16 = (ms->cParams).targetLength;
  pBVar6 = (ms->window).base;
  uVar4 = (ms->window).dictLimit;
  iStart = pBVar6 + uVar4;
  pZVar7 = ms->dictMatchState;
  uVar5 = (pZVar7->window).dictLimit;
  mEnd = (pZVar7->window).nextSrc;
  pBVar8 = (pZVar7->window).base;
  pBVar34 = pBVar8 + uVar5;
  uVar32 = ((int)pBVar8 - (int)mEnd) + uVar4;
  uVar33 = (ulong)uVar32;
  uVar20 = (ms->cParams).minMatch;
  pUVar9 = ms->hashTable;
  iEnd = (BYTE *)((long)src + srcSize);
  plVar2 = (long *)((long)src + (srcSize - 8));
  pUVar10 = pZVar7->hashTable;
  plVar28 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)pBVar34) + (long)src);
  uVar17 = (ulong)(uVar16 + (uVar16 == 0));
  local_f4 = *rep;
  UVar36 = rep[1];
  iVar31 = (int)pBVar6;
  cVar14 = (char)(ms->cParams).hashLog;
  cVar13 = (char)(pZVar7->cParams).hashLog;
  if (uVar20 == 5) {
    bVar19 = 0x40 - cVar14;
    plVar21 = (long *)(iEnd + -0x20);
LAB_001b0a62:
    if (plVar28 < plVar2) {
      lVar37 = *plVar28;
      uVar25 = (ulong)(lVar37 * -0x30e4432345000000) >> (bVar19 & 0x3f);
      uVar26 = (long)plVar28 - (long)pBVar6;
      uVar16 = pUVar9[uVar25];
      UVar27 = (U32)uVar26;
      uVar20 = (UVar27 - local_f4) + 1;
      pUVar9[uVar25] = UVar27;
      if ((uVar4 - 1) - uVar20 < 3) {
LAB_001b0ac4:
        if (uVar16 <= uVar4) {
          uVar16 = pUVar10[(ulong)(lVar37 * -0x30e4432345000000) >> (0x40U - cVar13 & 0x3f)];
          uVar25 = (ulong)uVar16;
          if ((uVar16 <= uVar5) || (*(int *)(pBVar8 + uVar25) != (int)*plVar28)) goto LAB_001b0b5c;
          UVar15 = (UVar27 - uVar32) - uVar16;
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar28 + 4),pBVar8 + uVar25 + 4,iEnd,mEnd,iStart);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), pBVar34 < pBVar8 + lVar37 + uVar25 &&
               (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == pBVar8[lVar37 + (uVar25 - 1)]));
              lVar37 = lVar37 + -1) {
          }
          uVar25 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b0e5d:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar25) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar25) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001b0e5d;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b11cf;
        }
        piVar35 = (int *)(pBVar6 + uVar16);
        if (*piVar35 == (int)*plVar28) {
          UVar15 = (int)plVar28 - (int)piVar35;
          sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 4),(BYTE *)(piVar35 + 1),iEnd);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), iStart < (BYTE *)((long)piVar35 + lVar37)
               && (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == *(BYTE *)((long)piVar35 + lVar37 + -1)));
              lVar37 = lVar37 + -1) {
          }
          uVar25 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b0c63:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar25) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar25) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001b0c63;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b11cf;
        }
LAB_001b0b5c:
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar17);
      }
      else {
        piVar35 = (int *)(pBVar6 + uVar20);
        if (uVar20 < uVar4) {
          piVar35 = (int *)(pBVar8 + (uVar20 - uVar32));
        }
        if (*piVar35 != *(int *)((long)plVar28 + 1)) goto LAB_001b0ac4;
        plVar1 = (long *)((long)plVar28 + 1);
        pBVar22 = iEnd;
        if (uVar20 < uVar4) {
          pBVar22 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar28 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar22,iStart);
        uVar25 = (long)plVar1 - (long)src;
        plVar28 = (long *)seqStore->lit;
        if (plVar21 < plVar1) {
          ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b0bef:
          seqStore->lit = seqStore->lit + uVar25;
          psVar30 = seqStore->sequences;
          if (0xffff < uVar25) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar37 = *(long *)((long)src + 8);
          *plVar28 = *src;
          plVar28[1] = lVar37;
          pBVar22 = seqStore->lit;
          if (0x10 < uVar25) {
            lVar37 = *(long *)((long)src + 0x18);
            *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar22 + 0x18) = lVar37;
            if (0x20 < (long)uVar25) {
              lVar37 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar12 = puVar3[1];
                pBVar23 = pBVar22 + lVar37 + 0x20;
                *(undefined8 *)pBVar23 = *puVar3;
                *(undefined8 *)(pBVar23 + 8) = uVar12;
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar12 = puVar3[1];
                *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                lVar37 = lVar37 + 0x20;
              } while (pBVar23 + 0x20 < pBVar22 + uVar25);
            }
            goto LAB_001b0bef;
          }
          seqStore->lit = pBVar22 + uVar25;
          psVar30 = seqStore->sequences;
        }
        psVar30->litLength = (U16)uVar25;
        psVar30->offset = 1;
joined_r0x001b11cf:
        if (0xffff < sVar18 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(sVar18 + 4 + (long)plVar1);
        psVar30->matchLength = (U16)(sVar18 + 1);
        seqStore->sequences = psVar30 + 1;
        src = plVar28;
        if (plVar28 <= plVar2) {
          pUVar9[(ulong)(*(long *)(pBVar6 + (uVar26 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                 (bVar19 & 0x3f)] = UVar27 + 2;
          pUVar9[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e4432345000000) >> (bVar19 & 0x3f)] =
               ((int)plVar28 + -2) - iVar31;
          UVar27 = UVar36;
          for (; UVar36 = UVar27, src = plVar28, plVar28 <= plVar2;
              plVar28 = (long *)((long)plVar28 + sVar18 + 4)) {
            UVar27 = (int)plVar28 - iVar31;
            uVar16 = UVar27 - UVar36;
            pBVar22 = pBVar6;
            if (uVar16 < uVar4) {
              pBVar22 = pBVar8 + -uVar33;
            }
            if (((uVar4 - 1) - uVar16 < 3) || (*(int *)(pBVar22 + uVar16) != (int)*plVar28)) break;
            pBVar23 = iEnd;
            if (uVar16 < uVar4) {
              pBVar23 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)(pBVar22 + uVar16) + 4),
                                iEnd,pBVar23,iStart);
            plVar1 = (long *)seqStore->lit;
            if (plVar21 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar1,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar21);
            }
            else {
              lVar37 = plVar28[1];
              *plVar1 = *plVar28;
              plVar1[1] = lVar37;
            }
            psVar30 = seqStore->sequences;
            psVar30->litLength = 0;
            psVar30->offset = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar30->matchLength = (U16)(sVar18 + 1);
            seqStore->sequences = psVar30 + 1;
            pUVar9[(ulong)(*plVar28 * -0x30e4432345000000) >> (bVar19 & 0x3f)] = UVar27;
            UVar27 = local_f4;
            local_f4 = UVar36;
          }
        }
      }
      goto LAB_001b0a62;
    }
  }
  else if (uVar20 == 6) {
    bVar19 = 0x40 - cVar14;
    plVar21 = (long *)(iEnd + -0x20);
LAB_001b02a1:
    if (plVar28 < plVar2) {
      lVar37 = *plVar28;
      uVar25 = (ulong)(lVar37 * -0x30e4432340650000) >> (bVar19 & 0x3f);
      uVar26 = (long)plVar28 - (long)pBVar6;
      uVar16 = pUVar9[uVar25];
      UVar27 = (U32)uVar26;
      uVar20 = (UVar27 - local_f4) + 1;
      pUVar9[uVar25] = UVar27;
      if ((uVar4 - 1) - uVar20 < 3) {
LAB_001b0303:
        if (uVar16 <= uVar4) {
          uVar16 = pUVar10[(ulong)(lVar37 * -0x30e4432340650000) >> (0x40U - cVar13 & 0x3f)];
          uVar25 = (ulong)uVar16;
          if ((uVar16 <= uVar5) || (*(int *)(pBVar8 + uVar25) != (int)*plVar28)) goto LAB_001b039b;
          UVar15 = (UVar27 - uVar32) - uVar16;
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar28 + 4),pBVar8 + uVar25 + 4,iEnd,mEnd,iStart);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), pBVar34 < pBVar8 + lVar37 + uVar25 &&
               (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == pBVar8[lVar37 + (uVar25 - 1)]));
              lVar37 = lVar37 + -1) {
          }
          uVar25 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b0683:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar25) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar25) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001b0683;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b0a0a;
        }
        piVar35 = (int *)(pBVar6 + uVar16);
        if (*piVar35 == (int)*plVar28) {
          UVar15 = (int)plVar28 - (int)piVar35;
          sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 4),(BYTE *)(piVar35 + 1),iEnd);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), iStart < (BYTE *)((long)piVar35 + lVar37)
               && (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == *(BYTE *)((long)piVar35 + lVar37 + -1)));
              lVar37 = lVar37 + -1) {
          }
          uVar25 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b0498:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar25) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar25) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001b0498;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b0a0a;
        }
LAB_001b039b:
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar17);
      }
      else {
        piVar35 = (int *)(pBVar6 + uVar20);
        if (uVar20 < uVar4) {
          piVar35 = (int *)(pBVar8 + (uVar20 - uVar32));
        }
        if (*piVar35 != *(int *)((long)plVar28 + 1)) goto LAB_001b0303;
        plVar1 = (long *)((long)plVar28 + 1);
        pBVar22 = iEnd;
        if (uVar20 < uVar4) {
          pBVar22 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar28 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar22,iStart);
        uVar25 = (long)plVar1 - (long)src;
        plVar28 = (long *)seqStore->lit;
        if (plVar21 < plVar1) {
          ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b0429:
          seqStore->lit = seqStore->lit + uVar25;
          psVar30 = seqStore->sequences;
          if (0xffff < uVar25) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar37 = *(long *)((long)src + 8);
          *plVar28 = *src;
          plVar28[1] = lVar37;
          pBVar22 = seqStore->lit;
          if (0x10 < uVar25) {
            lVar37 = *(long *)((long)src + 0x18);
            *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar22 + 0x18) = lVar37;
            if (0x20 < (long)uVar25) {
              lVar37 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar12 = puVar3[1];
                pBVar23 = pBVar22 + lVar37 + 0x20;
                *(undefined8 *)pBVar23 = *puVar3;
                *(undefined8 *)(pBVar23 + 8) = uVar12;
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar12 = puVar3[1];
                *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                lVar37 = lVar37 + 0x20;
              } while (pBVar23 + 0x20 < pBVar22 + uVar25);
            }
            goto LAB_001b0429;
          }
          seqStore->lit = pBVar22 + uVar25;
          psVar30 = seqStore->sequences;
        }
        psVar30->litLength = (U16)uVar25;
        psVar30->offset = 1;
joined_r0x001b0a0a:
        if (0xffff < sVar18 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(sVar18 + 4 + (long)plVar1);
        psVar30->matchLength = (U16)(sVar18 + 1);
        seqStore->sequences = psVar30 + 1;
        src = plVar28;
        if (plVar28 <= plVar2) {
          pUVar9[(ulong)(*(long *)(pBVar6 + (uVar26 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                 (bVar19 & 0x3f)] = UVar27 + 2;
          pUVar9[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e4432340650000) >> (bVar19 & 0x3f)] =
               ((int)plVar28 + -2) - iVar31;
          UVar27 = UVar36;
          for (; UVar36 = UVar27, src = plVar28, plVar28 <= plVar2;
              plVar28 = (long *)((long)plVar28 + sVar18 + 4)) {
            UVar27 = (int)plVar28 - iVar31;
            uVar16 = UVar27 - UVar36;
            pBVar22 = pBVar6;
            if (uVar16 < uVar4) {
              pBVar22 = pBVar8 + -uVar33;
            }
            if (((uVar4 - 1) - uVar16 < 3) || (*(int *)(pBVar22 + uVar16) != (int)*plVar28)) break;
            pBVar23 = iEnd;
            if (uVar16 < uVar4) {
              pBVar23 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)(pBVar22 + uVar16) + 4),
                                iEnd,pBVar23,iStart);
            plVar1 = (long *)seqStore->lit;
            if (plVar21 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar1,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar21);
            }
            else {
              lVar37 = plVar28[1];
              *plVar1 = *plVar28;
              plVar1[1] = lVar37;
            }
            psVar30 = seqStore->sequences;
            psVar30->litLength = 0;
            psVar30->offset = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar30->matchLength = (U16)(sVar18 + 1);
            seqStore->sequences = psVar30 + 1;
            pUVar9[(ulong)(*plVar28 * -0x30e4432340650000) >> (bVar19 & 0x3f)] = UVar27;
            UVar27 = local_f4;
            local_f4 = UVar36;
          }
        }
      }
      goto LAB_001b02a1;
    }
  }
  else if (uVar20 == 7) {
    bVar19 = 0x40 - cVar14;
    plVar21 = (long *)(iEnd + -0x20);
LAB_001afae8:
    if (plVar28 < plVar2) {
      lVar37 = *plVar28;
      uVar25 = (ulong)(lVar37 * -0x30e44323405a9d00) >> (bVar19 & 0x3f);
      uVar26 = (long)plVar28 - (long)pBVar6;
      uVar16 = pUVar9[uVar25];
      UVar27 = (U32)uVar26;
      uVar20 = (UVar27 - local_f4) + 1;
      pUVar9[uVar25] = UVar27;
      if ((uVar4 - 1) - uVar20 < 3) {
LAB_001afb4a:
        if (uVar16 <= uVar4) {
          uVar16 = pUVar10[(ulong)(lVar37 * -0x30e44323405a9d00) >> (0x40U - cVar13 & 0x3f)];
          uVar25 = (ulong)uVar16;
          if ((uVar16 <= uVar5) || (*(int *)(pBVar8 + uVar25) != (int)*plVar28)) goto LAB_001afbe2;
          UVar15 = (UVar27 - uVar32) - uVar16;
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar28 + 4),pBVar8 + uVar25 + 4,iEnd,mEnd,iStart);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), pBVar34 < pBVar8 + lVar37 + uVar25 &&
               (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == pBVar8[lVar37 + (uVar25 - 1)]));
              lVar37 = lVar37 + -1) {
          }
          uVar25 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001afeca:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar25) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar25) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001afeca;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b023d;
        }
        piVar35 = (int *)(pBVar6 + uVar16);
        if (*piVar35 == (int)*plVar28) {
          UVar15 = (int)plVar28 - (int)piVar35;
          sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 4),(BYTE *)(piVar35 + 1),iEnd);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), iStart < (BYTE *)((long)piVar35 + lVar37)
               && (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == *(BYTE *)((long)piVar35 + lVar37 + -1)));
              lVar37 = lVar37 + -1) {
          }
          uVar25 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001afcdf:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar25) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar25) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar25) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001afcdf;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b023d;
        }
LAB_001afbe2:
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar17);
      }
      else {
        piVar35 = (int *)(pBVar6 + uVar20);
        if (uVar20 < uVar4) {
          piVar35 = (int *)(pBVar8 + (uVar20 - uVar32));
        }
        if (*piVar35 != *(int *)((long)plVar28 + 1)) goto LAB_001afb4a;
        plVar1 = (long *)((long)plVar28 + 1);
        pBVar22 = iEnd;
        if (uVar20 < uVar4) {
          pBVar22 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar28 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar22,iStart);
        uVar25 = (long)plVar1 - (long)src;
        plVar28 = (long *)seqStore->lit;
        if (plVar21 < plVar1) {
          ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001afc70:
          seqStore->lit = seqStore->lit + uVar25;
          psVar30 = seqStore->sequences;
          if (0xffff < uVar25) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar37 = *(long *)((long)src + 8);
          *plVar28 = *src;
          plVar28[1] = lVar37;
          pBVar22 = seqStore->lit;
          if (0x10 < uVar25) {
            lVar37 = *(long *)((long)src + 0x18);
            *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar22 + 0x18) = lVar37;
            if (0x20 < (long)uVar25) {
              lVar37 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar12 = puVar3[1];
                pBVar23 = pBVar22 + lVar37 + 0x20;
                *(undefined8 *)pBVar23 = *puVar3;
                *(undefined8 *)(pBVar23 + 8) = uVar12;
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar12 = puVar3[1];
                *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                lVar37 = lVar37 + 0x20;
              } while (pBVar23 + 0x20 < pBVar22 + uVar25);
            }
            goto LAB_001afc70;
          }
          seqStore->lit = pBVar22 + uVar25;
          psVar30 = seqStore->sequences;
        }
        psVar30->litLength = (U16)uVar25;
        psVar30->offset = 1;
joined_r0x001b023d:
        if (0xffff < sVar18 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(sVar18 + 4 + (long)plVar1);
        psVar30->matchLength = (U16)(sVar18 + 1);
        seqStore->sequences = psVar30 + 1;
        src = plVar28;
        if (plVar28 <= plVar2) {
          pUVar9[(ulong)(*(long *)(pBVar6 + (uVar26 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                 (bVar19 & 0x3f)] = UVar27 + 2;
          pUVar9[(ulong)(*(long *)((long)plVar28 + -2) * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] =
               ((int)plVar28 + -2) - iVar31;
          UVar27 = UVar36;
          for (; UVar36 = UVar27, src = plVar28, plVar28 <= plVar2;
              plVar28 = (long *)((long)plVar28 + sVar18 + 4)) {
            UVar27 = (int)plVar28 - iVar31;
            uVar16 = UVar27 - UVar36;
            pBVar22 = pBVar6;
            if (uVar16 < uVar4) {
              pBVar22 = pBVar8 + -uVar33;
            }
            if (((uVar4 - 1) - uVar16 < 3) || (*(int *)(pBVar22 + uVar16) != (int)*plVar28)) break;
            pBVar23 = iEnd;
            if (uVar16 < uVar4) {
              pBVar23 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)(pBVar22 + uVar16) + 4),
                                iEnd,pBVar23,iStart);
            plVar1 = (long *)seqStore->lit;
            if (plVar21 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar1,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar21);
            }
            else {
              lVar37 = plVar28[1];
              *plVar1 = *plVar28;
              plVar1[1] = lVar37;
            }
            psVar30 = seqStore->sequences;
            psVar30->litLength = 0;
            psVar30->offset = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar30->matchLength = (U16)(sVar18 + 1);
            seqStore->sequences = psVar30 + 1;
            pUVar9[(ulong)(*plVar28 * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = UVar27;
            UVar27 = local_f4;
            local_f4 = UVar36;
          }
        }
      }
      goto LAB_001afae8;
    }
  }
  else {
    bVar19 = 0x20 - cVar14;
    plVar21 = (long *)(iEnd + -0x20);
LAB_001b121a:
    if (plVar28 < plVar2) {
      uVar24 = (uint)((int)*plVar28 * -0x61c8864f) >> (bVar19 & 0x1f);
      uVar25 = (long)plVar28 - (long)pBVar6;
      uVar16 = pUVar9[uVar24];
      UVar27 = (U32)uVar25;
      uVar20 = (UVar27 - local_f4) + 1;
      pUVar9[uVar24] = UVar27;
      if ((uVar4 - 1) - uVar20 < 3) {
LAB_001b1277:
        if (uVar16 <= uVar4) {
          uVar16 = pUVar10[(uint)((int)*plVar28 * -0x61c8864f) >> (0x20U - cVar13 & 0x1f)];
          uVar26 = (ulong)uVar16;
          if ((uVar16 <= uVar5) || (*(int *)(pBVar8 + uVar26) != (int)*plVar28)) goto LAB_001b130c;
          UVar15 = (UVar27 - uVar32) - uVar16;
          sVar18 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar28 + 4),pBVar8 + uVar26 + 4,iEnd,mEnd,iStart);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), pBVar34 < pBVar8 + lVar37 + uVar26 &&
               (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == pBVar8[lVar37 + (uVar26 - 1)]));
              lVar37 = lVar37 + -1) {
          }
          uVar26 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b15eb:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar26) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar26) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar26) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001b15eb;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b194f;
        }
        piVar35 = (int *)(pBVar6 + uVar16);
        if (*piVar35 == (int)*plVar28) {
          UVar15 = (int)plVar28 - (int)piVar35;
          sVar18 = ZSTD_count((BYTE *)((long)plVar28 + 4),(BYTE *)(piVar35 + 1),iEnd);
          for (lVar37 = 0;
              ((plVar1 = (long *)(lVar37 + (long)plVar28), iStart < (BYTE *)((long)piVar35 + lVar37)
               && (src < plVar1)) &&
              (*(BYTE *)((long)plVar28 + lVar37 + -1) == *(BYTE *)((long)piVar35 + lVar37 + -1)));
              lVar37 = lVar37 + -1) {
          }
          uVar26 = (long)plVar1 - (long)src;
          plVar11 = (long *)seqStore->lit;
          if (plVar21 < plVar1) {
            ZSTD_safecopyLiterals((BYTE *)plVar11,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b1409:
            seqStore->lit = seqStore->lit + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
            if (0xffff < uVar26) {
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar29 = *(long *)((long)src + 8);
            *plVar11 = *src;
            plVar11[1] = lVar29;
            pBVar22 = seqStore->lit;
            if (0x10 < uVar26) {
              lVar29 = *(long *)((long)src + 0x18);
              *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar22 + 0x18) = lVar29;
              if (0x20 < (long)uVar26) {
                lVar29 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x20);
                  uVar12 = puVar3[1];
                  pBVar23 = pBVar22 + lVar29 + 0x20;
                  *(undefined8 *)pBVar23 = *puVar3;
                  *(undefined8 *)(pBVar23 + 8) = uVar12;
                  puVar3 = (undefined8 *)((long)src + lVar29 + 0x30);
                  uVar12 = puVar3[1];
                  *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                  lVar29 = lVar29 + 0x20;
                } while (pBVar23 + 0x20 < pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src)));
              }
              goto LAB_001b1409;
            }
            seqStore->lit = pBVar22 + (long)((long)plVar28 + (lVar37 - (long)src));
            psVar30 = seqStore->sequences;
          }
          sVar18 = sVar18 - lVar37;
          psVar30->litLength = (short)lVar37 + ((short)plVar28 - (short)src);
          psVar30->offset = UVar15 + 3;
          UVar36 = local_f4;
          local_f4 = UVar15;
          goto joined_r0x001b194f;
        }
LAB_001b130c:
        plVar28 = (long *)((long)plVar28 + ((long)plVar28 - (long)src >> 8) + uVar17);
      }
      else {
        piVar35 = (int *)(pBVar6 + uVar20);
        if (uVar20 < uVar4) {
          piVar35 = (int *)(pBVar8 + (uVar20 - uVar32));
        }
        if (*piVar35 != *(int *)((long)plVar28 + 1)) goto LAB_001b1277;
        plVar1 = (long *)((long)plVar28 + 1);
        pBVar22 = iEnd;
        if (uVar20 < uVar4) {
          pBVar22 = mEnd;
        }
        sVar18 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar28 + 5),(BYTE *)(piVar35 + 1),iEnd,pBVar22,iStart);
        uVar26 = (long)plVar1 - (long)src;
        plVar28 = (long *)seqStore->lit;
        if (plVar21 < plVar1) {
          ZSTD_safecopyLiterals((BYTE *)plVar28,(BYTE *)src,(BYTE *)plVar1,(BYTE *)plVar21);
LAB_001b139a:
          seqStore->lit = seqStore->lit + uVar26;
          psVar30 = seqStore->sequences;
          if (0xffff < uVar26) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar37 = *(long *)((long)src + 8);
          *plVar28 = *src;
          plVar28[1] = lVar37;
          pBVar22 = seqStore->lit;
          if (0x10 < uVar26) {
            lVar37 = *(long *)((long)src + 0x18);
            *(long *)(pBVar22 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar22 + 0x18) = lVar37;
            if (0x20 < (long)uVar26) {
              lVar37 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x20);
                uVar12 = puVar3[1];
                pBVar23 = pBVar22 + lVar37 + 0x20;
                *(undefined8 *)pBVar23 = *puVar3;
                *(undefined8 *)(pBVar23 + 8) = uVar12;
                puVar3 = (undefined8 *)((long)src + lVar37 + 0x30);
                uVar12 = puVar3[1];
                *(undefined8 *)(pBVar23 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar23 + 0x18) = uVar12;
                lVar37 = lVar37 + 0x20;
              } while (pBVar23 + 0x20 < pBVar22 + uVar26);
            }
            goto LAB_001b139a;
          }
          seqStore->lit = pBVar22 + uVar26;
          psVar30 = seqStore->sequences;
        }
        psVar30->litLength = (U16)uVar26;
        psVar30->offset = 1;
joined_r0x001b194f:
        if (0xffff < sVar18 + 1) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
        }
        plVar28 = (long *)(sVar18 + 4 + (long)plVar1);
        psVar30->matchLength = (U16)(sVar18 + 1);
        seqStore->sequences = psVar30 + 1;
        src = plVar28;
        if (plVar28 <= plVar2) {
          pUVar9[(uint)(*(int *)(pBVar6 + (uVar25 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar19 & 0x1f)] = UVar27 + 2;
          pUVar9[(uint)(*(int *)((long)plVar28 + -2) * -0x61c8864f) >> (bVar19 & 0x1f)] =
               ((int)plVar28 + -2) - iVar31;
          UVar27 = UVar36;
          for (; UVar36 = UVar27, src = plVar28, plVar28 <= plVar2;
              plVar28 = (long *)((long)plVar28 + sVar18 + 4)) {
            UVar27 = (int)plVar28 - iVar31;
            uVar16 = UVar27 - UVar36;
            pBVar22 = pBVar6;
            if (uVar16 < uVar4) {
              pBVar22 = pBVar8 + -uVar33;
            }
            if (((uVar4 - 1) - uVar16 < 3) || (*(int *)(pBVar22 + uVar16) != (int)*plVar28)) break;
            pBVar23 = iEnd;
            if (uVar16 < uVar4) {
              pBVar23 = mEnd;
            }
            sVar18 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar28 + 4),(BYTE *)((long)(pBVar22 + uVar16) + 4),
                                iEnd,pBVar23,iStart);
            plVar1 = (long *)seqStore->lit;
            if (plVar21 < plVar28) {
              ZSTD_safecopyLiterals((BYTE *)plVar1,(BYTE *)plVar28,(BYTE *)plVar28,(BYTE *)plVar21);
            }
            else {
              lVar37 = plVar28[1];
              *plVar1 = *plVar28;
              plVar1[1] = lVar37;
            }
            psVar30 = seqStore->sequences;
            psVar30->litLength = 0;
            psVar30->offset = 1;
            if (0xffff < sVar18 + 1) {
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar30 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar30->matchLength = (U16)(sVar18 + 1);
            seqStore->sequences = psVar30 + 1;
            pUVar9[(uint)((int)*plVar28 * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar27;
            UVar27 = local_f4;
            local_f4 = UVar36;
          }
        }
      }
      goto LAB_001b121a;
    }
  }
  *rep = local_f4;
  rep[1] = UVar36;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState != NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_dictMatchState_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}